

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  bool bVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  pointer ppVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar14;
  double recall;
  double precision;
  int local_a4;
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *local_a0;
  double local_98;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_90;
  pair<double,_double> local_78;
  double local_68;
  double dStack_60;
  uint64_t local_50;
  uint64_t local_48;
  undefined8 uStack_40;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a4 = labelId;
  getPositiveCounts(&local_90,this,labelId);
  if (local_90.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a0 = (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__;
    if (local_a4 != -1) {
      this = (Meter *)std::__detail::
                      _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->labelMetrics_,&local_a4);
    }
    local_50 = (this->metrics_).gold;
    uVar6 = (long)local_90.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_90.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    uStack_40 = 0;
    ppVar7 = local_90.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = local_50;
    if (0 < (long)uVar6) {
      auVar10._8_4_ = (int)(local_50 >> 0x20);
      auVar10._0_8_ = local_50;
      auVar10._12_4_ = 0x45300000;
      dStack_60 = auVar10._8_8_ - 1.9342813113834067e+25;
      local_68 = dStack_60 + ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0);
      do {
        uVar5 = uVar6 >> 1;
        uVar1 = ppVar7[uVar5].first;
        uVar2 = ppVar7[uVar5].second;
        local_78.first =
             ((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar1 & 0xffffffff | 0x4330000000000000);
        local_78.second =
             ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar2 & 0xffffffff | 0x4330000000000000);
        local_98 = local_68;
        bVar4 = utils::compareFirstLess(&local_78,&local_98);
        uVar6 = uVar6 + ~uVar5;
        ppVar8 = ppVar7 + uVar5 + 1;
        if (!bVar4) {
          uVar6 = uVar5;
          ppVar8 = ppVar7;
        }
        ppVar7 = ppVar8;
      } while (0 < (long)uVar6);
    }
    uVar3 = local_50;
    __return_storage_ptr__ =
         (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)local_a0;
    if (local_90.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppVar7 + (ppVar7 !=
                 local_90.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      auVar12._12_4_ = (undefined4)((ulong)uStack_40 >> 0x20);
      auVar12._8_4_ = (int)(local_48 >> 0x20);
      auVar12._0_8_ = local_48;
      auVar11._8_8_ = auVar12._8_8_;
      auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)local_48);
      auVar13._0_12_ = auVar11._0_12_;
      auVar13._12_4_ = 0x45300000;
      dStack_60 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_68 = dStack_60 + (auVar11._0_8_ - 4503599627370496.0);
      ppVar8 = local_90.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_78.first = 0.0;
        dVar9 = ((double)(ppVar8->first >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(ppVar8->first & 0xffffffff | 0x4330000000000000);
        dVar14 = ((double)(ppVar8->second >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(ppVar8->second & 0xffffffff | 0x4330000000000000) + dVar9;
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          local_78.first = dVar9 / dVar14;
        }
        local_98 = NAN;
        if (uVar3 != 0) {
          local_98 = dVar9 / local_68;
        }
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double&,double&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_78.first,&local_98);
        ppVar8 = ppVar8 + 1;
      } while (ppVar8 != ppVar7 + (ppVar7 !=
                                  local_90.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish));
    }
    local_78.first = 1.0;
    local_98 = 0.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_78.first,&local_98);
  }
  if (local_90.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
         (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}